

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_operators.hpp
# Opt level: O1

type * __thiscall
Disa::cross_product<double,3ul,3ul>
          (type *__return_storage_ptr__,Disa *this,Vector_Dense<double,_3UL> *vector_0,
          Vector_Dense<double,_3UL> *vector_1)

{
  double dVar1;
  double dVar2;
  double dVar3;
  initializer_list<double> local_30;
  double local_20;
  double local_18;
  double local_10;
  
  dVar1 = (vector_0->super_array<double,_3UL>)._M_elems[1];
  dVar2 = (vector_0->super_array<double,_3UL>)._M_elems[2];
  local_20 = *(double *)(this + 8) * dVar2 - dVar1 * *(double *)(this + 0x10);
  local_30._M_array = &local_20;
  dVar3 = (vector_0->super_array<double,_3UL>)._M_elems[0];
  local_18 = *(double *)(this + 0x10) * dVar3 - dVar2 * *(double *)this;
  local_10 = *(double *)this * dVar1 - dVar3 * *(double *)(this + 8);
  local_30._M_len = 3;
  Vector_Dense<double,_3UL>::Vector_Dense(__return_storage_ptr__,&local_30);
  return __return_storage_ptr__;
}

Assistant:

constexpr typename Static_Promoter<Vector_Dense<_type, _size_0>, Vector_Dense<_type, _size_1>>::type cross_product(
const Vector_Dense<_type, _size_0>& vector_0, const Vector_Dense<_type, _size_1>& vector_1) {
  ASSERT_DEBUG(vector_0.size() == vector_1.size(), "Incompatible vector sizes, " + std::to_string(vector_0.size()) +
                                                   " vs. " + std::to_string(vector_1.size()) + ".");
  ASSERT_DEBUG(vector_0.size() == 2 || vector_0.size() == 3,
               "Incompatible vector size, " + std::to_string(vector_0.size()) + ", must be 2 or 3.");
  typedef typename Static_Promoter<Vector_Dense<_type, _size_0>, Vector_Dense<_type, _size_1>>::type _return_vector;
  if(vector_0.size() == 2) return {0.0, 0.0, vector_0[0] * vector_1[1] - vector_0[1] * vector_1[0]};
  else
    return {vector_0[1] * vector_1[2] - vector_0[2] * vector_1[1],
            vector_0[2] * vector_1[0] - vector_0[0] * vector_1[2],
            vector_0[0] * vector_1[1] - vector_0[1] * vector_1[0]};
}